

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

void rde_aux(List *code,PatternRange *ranges,int m68kop,ParsedOpcodeInfo *info,CCVariant *var,
            int expand_mask)

{
  int iVar1;
  int field_length;
  bool bVar2;
  Token *pTVar3;
  int local_54;
  uint local_50;
  int i;
  int constant;
  BOOL is_constant;
  int length;
  int index;
  Token *t;
  int expand_mask_local;
  CCVariant *var_local;
  ParsedOpcodeInfo *info_local;
  int m68kop_local;
  PatternRange *ranges_local;
  List *code_local;
  
  if (code != (List *)0x0) {
    pTVar3 = &code->token;
    if (((((pTVar3->type == TOK_DOLLAR_DATA_REGISTER) ||
          (pTVar3->type == TOK_DOLLAR_ADDRESS_REGISTER)) ||
         (pTVar3->type == TOK_DOLLAR_GENERAL_REGISTER)) ||
        ((pTVar3->type == TOK_DOLLAR_AMODE || (pTVar3->type == TOK_DOLLAR_REVERSED_AMODE)))) ||
       ((pTVar3->type == TOK_DOLLAR_NUMBER ||
        ((pTVar3->type == TOK_DOLLAR_AMODE_PTR || (pTVar3->type == TOK_DOLLAR_REVERSED_AMODE_PTR))))
       )) {
      bVar2 = false;
      iVar1 = ranges[(code->token).u.reginfo.which].index;
      field_length = ranges[(code->token).u.reginfo.which].length;
      if (iVar1 + field_length < 0x11) {
        local_50 = 0;
        bVar2 = true;
        for (local_54 = 0; local_54 < field_length; local_54 = local_54 + 1) {
          if (var->bits_to_expand[local_54 + iVar1] == '-') {
            bVar2 = false;
            break;
          }
          if ((m68kop & (1 << (0xfU - (char)iVar1 & 0x1f)) >> ((byte)local_54 & 0x1f)) != 0) {
            local_50 = (1 << ((char)field_length - 1U & 0x1f)) >> ((byte)local_54 & 0x1f) | local_50
            ;
          }
        }
      }
      else {
        local_50 = 0;
      }
      if (bVar2) {
        handle_constant_dollar_field(code,local_50,field_length);
      }
    }
    rde_aux(code->car,ranges,m68kop,info,var,expand_mask);
    rde_aux(code->cdr,ranges,m68kop,info,var,expand_mask);
  }
  return;
}

Assistant:

static void
rde_aux (List *code, const PatternRange *ranges, int m68kop,
	 const ParsedOpcodeInfo *info, const CCVariant *var, int expand_mask)
{
  Token *t;

  /* Base case: NULL list. */
  if (code == NULL)
    return;

  /* If we find a $ identifier, replace it with the appropriate expression. */
  t = &code->token;
  if (IS_DOLLAR_TOKEN (t->type))
    {
      int index, length;
      BOOL is_constant = FALSE;
      int constant;
      
      /* Fetch the bit range of that field. */
      index = ranges[t->u.dollarinfo.which].index;
      length = ranges[t->u.dollarinfo.which].length;
      
      /* See if this collapses to a known constant. */
      if (index + length <= 16)
	{
	  int i;
	  
	  /* Grab the constant and see if it's legitimate. */
	  constant = 0;
	  is_constant = TRUE;
	  for (i = 0; i < length; i++)
	    {
	      if (var->bits_to_expand[i + index] == '-')
		{
		  is_constant = FALSE;
		  break;
		}
	      else if (m68kop & ((1 << (15 - index)) >> i))
		constant |= (1 << (length - 1)) >> i;
	    }
	}
      else
	constant = 0;  /* To avoid compiler warnings. */

      if (is_constant)
	handle_constant_dollar_field (code, constant, length);
      else
	{
	}
    }

  /* Recurse on the rest of the list. */
  rde_aux (code->car, ranges, m68kop, info, var, expand_mask);
  rde_aux (code->cdr, ranges, m68kop, info, var, expand_mask);
}